

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O3

bool callMultipleSimpleFoo(void)

{
  code *pcVar1;
  iterator iVar2;
  int iVar3;
  bool bVar4;
  Test t;
  key_type local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_48;
  
  Test::Test((Test *)&local_48);
  iVar3 = 10;
  do {
    pcVar1 = accessor::
             Proxy<accessor::FunctionWrapper<Test,void>,accessor::FunctionWrapper<Test,void>>::value
    ;
    if (((ulong)accessor::
                Proxy<accessor::FunctionWrapper<Test,void>,accessor::FunctionWrapper<Test,void>>::
                value & 1) != 0) {
      pcVar1 = *(code **)(accessor::
                          Proxy<accessor::FunctionWrapper<Test,void>,accessor::FunctionWrapper<Test,void>>
                          ::value +
                         *(long *)(&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                       *)&local_48._M_impl)->_M_t)._M_impl.field_0x0 + DAT_001070c8)
                         + -1);
    }
    (*pcVar1)();
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"foo","");
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&local_48,&local_68);
  if ((_Rb_tree_header *)iVar2._M_node == &local_48._M_impl.super__Rb_tree_header) {
    bVar4 = false;
  }
  else {
    bVar4 = iVar2._M_node[2]._M_color == 10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_48);
  return bVar4;
}

Assistant:

bool callMultipleSimpleFoo()
{
  Test t;
  int callsNumber = 10;

  for (int i = 0; i < callsNumber; ++i )
  {
    ::accessor::callFunction<TestFoo>(t);
  }

  return (t.getMethodVisitedCounter("foo") == 10);
}